

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::at(value *this,char *path)

{
  bool bVar1;
  char *__rhs;
  char *in_stack_00000060;
  value *in_stack_00000068;
  value *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 local_59 [65];
  value *local_18;
  
  local_18 = find(in_stack_00000068,in_stack_00000060);
  bVar1 = is_undefined((value *)0x3e37f5);
  if (!bVar1) {
    return local_18;
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
  __rhs = (char *)__cxa_allocate_exception(0x48);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),"Value not found at ",(allocator *)__lhs);
  std::operator+(__lhs,__rhs);
  bad_value_cast::bad_value_cast((bad_value_cast *)CONCAT44(in_stack_ffffffffffffff94,uVar2),__lhs);
  __cxa_throw(__rhs,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::at(char const *path) const
	{
		value const &v=find(path);
		if(v.is_undefined())
			throw bad_value_cast(std::string("Value not found at ")+path );
		return v;
	}